

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O0

void __thiscall agg::trans_single_path::transform(trans_single_path *this,double *x,double *y)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  vertex_dist *pvVar4;
  ulong uVar5;
  double y2;
  double x2;
  uint local_60;
  uint k;
  uint j_1;
  uint i_1;
  uint j;
  uint i;
  double dd;
  double d;
  double dy;
  double dx;
  double y1;
  double x1;
  double *y_local;
  double *x_local;
  trans_single_path *this_local;
  
  if (this->m_status == ready) {
    if (1e-10 < this->m_base_length) {
      uVar2 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2 - 1);
      *x = (pvVar4->dist / this->m_base_length) * *x;
    }
    if (0.0 < *x || *x == 0.0) {
      dVar1 = *x;
      uVar2 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2 - 1);
      if (dVar1 < pvVar4->dist || dVar1 == pvVar4->dist) {
        uVar2 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        if ((this->m_preserve_x_scale & 1U) == 0) {
          uVar5 = (ulong)(*x * this->m_kindex);
          k = (uint)uVar5;
          local_60 = k + 1;
          pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                             ((pod_bvector<agg::vertex_dist,_6U> *)this,local_60);
          _j = pvVar4->dist;
          pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                             ((pod_bvector<agg::vertex_dist,_6U> *)this,k);
          _j = _j - pvVar4->dist;
          dd = (*x * this->m_kindex + -(double)(uVar5 & 0xffffffff)) * _j;
        }
        else {
          k = 0;
          local_60 = uVar2 - 1;
          uVar2 = k;
          while (k = uVar2, 1 < local_60 - k) {
            dVar1 = *x;
            uVar2 = k + local_60 >> 1;
            pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                               ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2);
            if (dVar1 < pvVar4->dist) {
              local_60 = uVar2;
              uVar2 = k;
            }
          }
          pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                             ((pod_bvector<agg::vertex_dist,_6U> *)this,k);
          dVar1 = pvVar4->dist;
          pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                             ((pod_bvector<agg::vertex_dist,_6U> *)this,local_60);
          _j = pvVar4->dist - dVar1;
          dd = *x - dVar1;
        }
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,k);
        y1 = pvVar4->x;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,k);
        dx = pvVar4->y;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,local_60);
        dy = pvVar4->x - y1;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,local_60);
        d = pvVar4->y - dx;
      }
      else {
        uVar2 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        uVar2 = uVar2 - 2;
        uVar3 = pod_bvector<agg::vertex_dist,_6U>::size((pod_bvector<agg::vertex_dist,_6U> *)this);
        uVar3 = uVar3 - 1;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3);
        y1 = pvVar4->x;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3);
        dx = pvVar4->y;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2);
        dy = y1 - pvVar4->x;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2);
        d = dx - pvVar4->y;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3);
        _j = pvVar4->dist;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar2);
        _j = _j - pvVar4->dist;
        dVar1 = *x;
        pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                           ((pod_bvector<agg::vertex_dist,_6U> *)this,uVar3);
        dd = dVar1 - pvVar4->dist;
      }
    }
    else {
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,0);
      y1 = pvVar4->x;
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,0);
      dx = pvVar4->y;
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,1);
      dy = pvVar4->x - y1;
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,1);
      d = pvVar4->y - dx;
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,1);
      _j = pvVar4->dist;
      pvVar4 = pod_bvector<agg::vertex_dist,_6U>::operator[]
                         ((pod_bvector<agg::vertex_dist,_6U> *)this,0);
      _j = _j - pvVar4->dist;
      dd = *x;
    }
    *x = (y1 + (dy * dd) / _j) - (*y * d) / _j;
    *y = dx + (d * dd) / _j + (*y * dy) / _j;
  }
  return;
}

Assistant:

void trans_single_path::transform(double *x, double *y) const
    {
        if(m_status == ready)
        {
            if(m_base_length > 1e-10)
            {
                *x *= m_src_vertices[m_src_vertices.size() - 1].dist / 
                      m_base_length;
            }

            double x1 = 0.0;
            double y1 = 0.0;
            double dx = 1.0;
            double dy = 1.0;
            double d  = 0.0;
            double dd = 1.0;
            if(*x < 0.0)
            {
                // Extrapolation on the left
                //--------------------------
                x1 = m_src_vertices[0].x;
                y1 = m_src_vertices[0].y;
                dx = m_src_vertices[1].x - x1;
                dy = m_src_vertices[1].y - y1;
                dd = m_src_vertices[1].dist - m_src_vertices[0].dist;
                d  = *x;
            }
            else
            if(*x > m_src_vertices[m_src_vertices.size() - 1].dist)
            {
                // Extrapolation on the right
                //--------------------------
                unsigned i = m_src_vertices.size() - 2;
                unsigned j = m_src_vertices.size() - 1;
                x1 = m_src_vertices[j].x;
                y1 = m_src_vertices[j].y;
                dx = x1 - m_src_vertices[i].x;
                dy = y1 - m_src_vertices[i].y;
                dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                d  = *x - m_src_vertices[j].dist;
            }
            else
            {
                // Interpolation
                //--------------------------
                unsigned i = 0;
                unsigned j = m_src_vertices.size() - 1;
                if(m_preserve_x_scale)
                {
                    unsigned k;
                    for(i = 0; (j - i) > 1; ) 
                    {
                        if(*x < m_src_vertices[k = (i + j) >> 1].dist) 
                        {
                            j = k; 
                        }
                        else 
                        {
                            i = k;
                        }
                    }
                    d  = m_src_vertices[i].dist;
                    dd = m_src_vertices[j].dist - d;
                    d  = *x - d;
                }
                else
                {
                    i = unsigned(*x * m_kindex);
                    j = i + 1;
                    dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                    d = ((*x * m_kindex) - i) * dd;
                }
                x1 = m_src_vertices[i].x;
                y1 = m_src_vertices[i].y;
                dx = m_src_vertices[j].x - x1;
                dy = m_src_vertices[j].y - y1;
            }
            double x2 = x1 + dx * d / dd;
            double y2 = y1 + dy * d / dd;
            *x = x2 - *y * dy / dd;
            *y = y2 + *y * dx / dd;
        }
    }